

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::insertFixup
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,LinkType z)

{
  bool bVar1;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *pRVar2;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *pRVar3;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *pRVar4;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_RSI;
  LinkType in_RDI;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *unaff_retaddr;
  LinkType y;
  Dir dir;
  LinkType zGrandParent;
  LinkType pZ;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffffb8;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffffc0;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  LinkType x;
  
  x = in_RDI;
  local_18 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
             getParent(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = isRed(in_stack_ffffffffffffffd0,in_RDI);
    if (!bVar1) break;
    pRVar2 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
             getParent(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
    pRVar3 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
             getChild(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8,kLeft);
    in_stack_ffffffffffffffd0 =
         (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
         getChild(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8,kLeft);
    bVar1 = isRed(in_stack_ffffffffffffffd0,in_RDI);
    if (bVar1) {
      makeBlack(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
      makeBlack(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
      makeRed(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
    }
    else {
      pRVar2 = in_RSI;
      pRVar4 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
               getChild(in_RSI,(LinkType)in_stack_ffffffffffffffb8,kLeft);
      in_stack_ffffffffffffffc0 = in_RSI;
      if (in_RSI == pRVar4) {
        pRVar2 = local_18;
        opposite((uint)(pRVar3 == local_18));
        rotate(unaff_retaddr,x,(Dir)((ulong)pRVar2 >> 0x20));
        getParent(in_RSI,(LinkType)local_18);
        getParent(in_RSI,(LinkType)local_18);
        in_stack_ffffffffffffffb8 = local_18;
        in_stack_ffffffffffffffc0 = in_RSI;
      }
      makeBlack(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
      makeRed(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
      rotate(unaff_retaddr,x,(Dir)((ulong)pRVar2 >> 0x20));
    }
    local_18 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
               getParent(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
    in_RSI = pRVar2;
  }
  makeBlack(in_stack_ffffffffffffffc0,(LinkType)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void insertFixup(LinkType z) {
    LinkType pZ = getParent(z);
    while (isRed(pZ)) {
      LinkType zGrandParent = getParent(pZ);
      assert(zGrandParent != kNoLink);

      Dir dir = Dir(getChild(zGrandParent, kLeft) == pZ);

      LinkType y = getChild(zGrandParent, dir);
      if (isRed(y)) {
        makeBlack(pZ);
        makeBlack(y);
        makeRed(zGrandParent);
        z = zGrandParent;
      } else {
        if (z == getChild(pZ, dir)) {
          z = pZ;
          rotate(z, opposite(dir));
          pZ = getParent(z);
          zGrandParent = getParent(pZ);
          assert(zGrandParent != kNoLink);
        }

        makeBlack(pZ);
        makeRed(zGrandParent);
        rotate(zGrandParent, dir);
      }

      pZ = getParent(z);
    }

    makeBlack(rootNode);
  }